

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O1

void __thiscall HinOut::compareData(HinOut *this,int lvl)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  pointer piVar4;
  pointer piVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> columnA;
  pair<int,_double> p;
  pair<int,_double> *local_68;
  iterator iStack_60;
  pair<int,_double> *local_58;
  long local_50;
  pair<int,_double> local_48;
  long local_38;
  
  if ((this->super_HPreData).numCol != this->onumCol) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Column counts differ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  if ((this->super_HPreData).numRow != this->onumRow) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Row counts differ",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  if (this->AcountX != this->oAcountX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AcountX counts differ",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  if ((this->super_HPreData).numCol < 1) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    do {
      piVar4 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar4[lVar11 + 1] - piVar4[lVar11] != piVar5[lVar11 + 1] - piVar5[lVar11]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"col length different: col[",0x1a);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->super_HPreData).numCol);
  }
  local_50 = lVar11;
  std::ostream::flush();
  if (0 < (this->super_HPreData).numCol) {
    lVar11 = 0;
    local_50 = local_50 << 4;
    do {
      local_68 = (pair<int,_double> *)0x0;
      iStack_60._M_current = (pair<int,_double> *)0x0;
      local_58 = (pair<int,_double> *)0x0;
      piVar4 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = piVar4[lVar11];
      lVar12 = (long)iVar10;
      lVar13 = lVar11 + 1;
      if (iVar10 < piVar4[lVar11 + 1]) {
        do {
          local_48.first =
               (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
          local_48.second =
               (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar12];
          if (iStack_60._M_current == local_58) {
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            _M_realloc_insert<std::pair<int,double>const&>
                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                       &local_68,iStack_60,&local_48);
          }
          else {
            *(ulong *)iStack_60._M_current = CONCAT44(local_48._4_4_,local_48.first);
            (iStack_60._M_current)->second = local_48.second;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->super_HPreData).Astart.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar13]);
      }
      piVar4 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = piVar4[lVar11];
      lVar12 = (long)iVar10;
      if (iVar10 < piVar4[lVar13]) {
        do {
          local_38 = lVar13;
          if (iStack_60._M_current != local_68) {
            lVar13 = 0x18;
            uVar9 = 0;
            do {
              if (local_68[uVar9].first ==
                  (this->oAindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12]) {
                pdVar1 = (this->oAvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start + lVar12;
                if ((local_68[uVar9].second != *pdVar1) ||
                   (NAN(local_68[uVar9].second) || NAN(*pdVar1))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"mismatch in row ",0x10);
                  poVar6 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)&std::cout,
                                      (this->super_HPreData).Aindex.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar12]);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6," col ",5);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar11);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6," in Avalue: ",0xc);
                  poVar6 = std::ostream::_M_insert<double>
                                     (*(double *)((long)&local_68->second + local_50));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6," in oAvalue: ",0xd);
                  poVar6 = std::ostream::_M_insert<double>
                                     ((this->oAvalue).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar12]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                }
                else {
                  if ((local_68 + uVar9 + 1 != iStack_60._M_current) &&
                     (lVar8 = (long)iStack_60._M_current - (long)(local_68 + uVar9 + 1) >> 4,
                     0 < lVar8)) {
                    lVar8 = lVar8 + 1;
                    puVar7 = (undefined8 *)((long)&local_68->first + lVar13);
                    do {
                      *(undefined4 *)(puVar7 + -3) = *(undefined4 *)(puVar7 + -1);
                      puVar7[-2] = *puVar7;
                      lVar8 = lVar8 + -1;
                      puVar7 = puVar7 + 2;
                    } while (1 < lVar8);
                  }
                  iStack_60._M_current = iStack_60._M_current + -1;
                }
              }
              uVar9 = uVar9 + 1;
              lVar13 = lVar13 + 0x10;
            } while (uVar9 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 4));
          }
          lVar12 = lVar12 + 1;
          lVar13 = local_38;
        } while (lVar12 < (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_38]);
      }
      lVar11 = lVar13;
      if (local_68 != (pair<int,_double> *)0x0) {
        operator_delete(local_68);
      }
    } while (lVar11 < (this->super_HPreData).numCol);
  }
  if ((0 < lvl) && (0 < (this->super_HPreData).numCol)) {
    lVar11 = 0;
    do {
      dVar2 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      dVar3 = (this->ocolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      dVar15 = ABS(dVar2);
      dVar14 = 1.0;
      if ((1.0 < dVar15) && (dVar14 = ABS(dVar3), dVar14 <= dVar15)) {
        dVar14 = dVar15;
      }
      dVar14 = ABS(dVar2 - dVar3) / dVar14;
      iVar10 = (int)lVar11;
      if ((1e-08 < dVar14) && ((dVar14 != 0.0 || (NAN(dVar14))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colCost[",8);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      }
      dVar2 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      dVar3 = (this->ocolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      dVar15 = ABS(dVar2);
      dVar14 = 1.0;
      if ((1.0 < dVar15) && (dVar14 = ABS(dVar3), dVar14 <= dVar15)) {
        dVar14 = dVar15;
      }
      dVar14 = ABS(dVar2 - dVar3) / dVar14;
      if ((1e-08 < dVar14) && ((dVar14 != 0.0 || (NAN(dVar14))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colLower[",9);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      }
      dVar2 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      dVar3 = (this->ocolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      dVar15 = ABS(dVar2);
      dVar14 = 1.0;
      if ((1.0 < dVar15) && (dVar14 = ABS(dVar3), dVar14 <= dVar15)) {
        dVar14 = dVar15;
      }
      dVar14 = ABS(dVar2 - dVar3) / dVar14;
      if ((1e-08 < dVar14) && ((dVar14 != 0.0 || (NAN(dVar14))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colUpper[",9);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->super_HPreData).numCol);
  }
  if ((1 < lvl) && (0 < (this->super_HPreData).numRow)) {
    lVar11 = 0;
    do {
      dVar2 = (this->super_HPreData).rowLower.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      dVar3 = (this->orowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      dVar15 = ABS(dVar2);
      dVar14 = 1.0;
      if ((1.0 < dVar15) && (dVar14 = ABS(dVar3), dVar14 <= dVar15)) {
        dVar14 = dVar15;
      }
      dVar14 = ABS(dVar2 - dVar3) / dVar14;
      if ((1e-08 < dVar14) && ((dVar14 != 0.0 || (NAN(dVar14))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rowLower[",9);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      }
      dVar2 = (this->super_HPreData).rowUpper.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11];
      dVar3 = (this->orowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      dVar15 = ABS(dVar2);
      dVar14 = 1.0;
      if ((1.0 < dVar15) && (dVar14 = ABS(dVar3), dVar14 <= dVar15)) {
        dVar14 = dVar15;
      }
      dVar14 = ABS(dVar2 - dVar3) / dVar14;
      if ((1e-08 < dVar14) && ((dVar14 != 0.0 || (NAN(dVar14))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rowUpper[",9);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->super_HPreData).numRow);
  }
  return;
}

Assistant:

void HinOut::compareData(int lvl) {
	int i;
	if (numCol != onumCol)
		cout <<"Column counts differ"<<endl;

	if (numRow != onumRow)
		cout <<"Row counts differ"<<endl;

	if (AcountX != oAcountX)
		cout <<"AcountX counts differ"<<endl;


	//matrix
	for (i=0; i<numCol; i++)
		if (Astart[i+1]-Astart[i] != oAstart[i+1]-oAstart[i])
			cout<<"col length different: col["<<i<<"]\n";

	cout<<flush;

//
//	for (i=0; i<AcountX; i++)
//		if (Aindex[i] != oAindex[i])
//			cout<<"Aindex["<<i<<"]";
//
//	for (i=0; i<AcountX; i++)
//		if (getdiff(Avalue[i] , oAvalue[i]))
//			cout<<"Avalue["<<i<<"]";

	//Aindex and Avalue can differ in their order:
	for (int j=0; j<numCol; j++) {
		vector<pair<int, double>> columnA, columnOA;
		for (int k=Astart[j]; k<Astart[j+1]; k++) {
			pair<int, double> p(Aindex[k], Avalue[k]);
			columnA.push_back(p);
		}

		for (int k=oAstart[j]; k<oAstart[j+1]; k++) {
			//pair<int, double> p(oAindex[k], oAvalue[k]);
			for (size_t l=0;l < columnA.size(); l++)
				if (get<0>(columnA[l])==oAindex[k]) {
					if (get<1>(columnA[l])==oAvalue[k]) {
						columnA.erase(columnA.begin() + l);
						continue;
					}
					else {
						cout<<"mismatch in row "<<Aindex[k]<<" col "<<j<< " in Avalue: "<< get<1>(columnA[i]) << " in oAvalue: "<< oAvalue[k] <<endl;
					}
				}
			//columnOA.push_back(p);
		}
	}






	if (lvl > 0) {


	for (i=0; i<numCol; i++) {
		if (getdiff(colCost[i] , ocolCost[i]))
			cout<<"colCost["<<i<<"]";
		if (getdiff(colLower[i] , ocolLower[i]))
			cout<<"colLower["<<i<<"]";
		if (getdiff(colUpper[i] , ocolUpper[i]))
			cout<<"colUpper["<<i<<"]";

	}

	}
	if (lvl>1) {


	for (i=0; i<numRow; i++) {
		if (getdiff(rowLower[i] , orowLower[i]))
			cout<<"rowLower["<<i<<"]";
		if (getdiff(rowUpper[i] , orowUpper[i]))
			cout<<"rowUpper["<<i<<"]";
	}

	}

}